

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall kj::(anonymous_namespace)::PromisedAsyncIoStream::write(PromisedAsyncIoStream *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  anon_unknown_123::PromisedAsyncIoStream::write
            ((PromisedAsyncIoStream *)this,in_ESI + -8,in_RDX,in_RCX);
  return;
}

Assistant:

kj::Promise<void> write(ArrayPtr<const byte> buffer) override {
    KJ_IF_SOME(s, stream) {
      return s->write(buffer);
    } else {
      return promise.addBranch().then([this,buffer]() {
        return KJ_ASSERT_NONNULL(stream)->write(buffer);
      });
    }
  }